

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O3

wchar_t path_nearest_unknown
                  (player *p,loc_conflict start,loc_conflict *dest_grid,int16_t **step_dirs)

{
  loc_conflict grid1;
  loc grid;
  _Bool only_known;
  bool bVar1;
  bool bVar2;
  loc *plVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc lVar8;
  long lVar9;
  chunk_conflict2 *c;
  long lVar10;
  long lVar11;
  wchar_t local_60;
  pfdistances *local_58;
  loc local_50;
  loc local_48;
  loc *local_40;
  int16_t **local_38;
  
  bVar1 = true;
  local_40 = (loc *)dest_grid;
  local_38 = step_dirs;
  do {
    _Var5 = true;
    do {
      only_known = _Var5;
      _Var5 = true;
      do {
        lVar8 = (loc)loc(-1,-1);
        c = p->cave;
        if (c->height < L'\x01') {
          local_58 = (pfdistances *)0x0;
        }
        else {
          local_60 = L'\x7fffffff';
          lVar11 = 0;
          lVar9 = 0;
          local_58 = (pfdistances *)0x0;
          local_48 = lVar8;
          do {
            if (L'\0' < c->width) {
              lVar10 = 0;
              do {
                lVar8 = (loc)(lVar11 + lVar10);
                _Var4 = loc_eq((loc_conflict)lVar8,start);
                wVar7 = local_60;
                grid = local_48;
                if ((!_Var4) &&
                   (_Var4 = square_isknown((chunk_conflict *)p->cave,lVar8), grid = local_48, _Var4)
                   ) {
                  if (bVar1) {
                    _Var4 = square_ispassable((chunk_conflict *)p->cave,lVar8);
                    grid = local_48;
                    if ((_Var4) &&
                       (wVar6 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar8,
                                                square_isknown,false), grid = local_48,
                       wVar6 != L'\b')) {
                      local_50.x = (wchar_t)lVar10;
                      local_50.y = (wchar_t)lVar9;
LAB_001ba678:
                      if (local_58 == (pfdistances *)0x0) {
                        local_58 = prepare_pfdistances(p,start,only_known,_Var5);
                      }
                      grid.y = local_50.y;
                      grid.x = local_50.x;
                      wVar7 = pfdistances_to_turncount(local_58,(loc_conflict)grid);
                      if (wVar7 < L'\x01' || local_60 <= wVar7) {
                        wVar7 = local_60;
                        grid = local_48;
                      }
                    }
                  }
                  else {
                    _Var4 = square_iscloseddoor((chunk_conflict *)p->cave,lVar8);
                    if ((((_Var4) ||
                         (_Var4 = square_isrubble((chunk_conflict *)p->cave,lVar8), grid = local_48,
                         _Var4)) &&
                        (wVar6 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar8,
                                                 square_isknown,false), grid = local_48,
                        wVar6 != L'\b')) &&
                       ((wVar6 = count_neighbors(&local_50,(chunk_conflict *)p->cave,lVar8,
                                                 square_isknownpassable,false), grid = local_48,
                        wVar6 != L'\0' &&
                        (grid1.y = local_50.y, grid1.x = local_50.x, _Var4 = loc_eq(grid1,start),
                        grid = local_48, !_Var4)))) goto LAB_001ba678;
                  }
                }
                local_48 = grid;
                local_60 = wVar7;
                lVar10 = lVar10 + 1;
                c = p->cave;
              } while (lVar10 < c->width);
            }
            lVar8 = local_48;
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + 0x100000000;
          } while (lVar9 < c->height);
          if (local_60 != L'\x7fffffff') {
            if ((local_58 == (pfdistances *)0x0) ||
               (_Var5 = square_in_bounds((chunk_conflict *)c,local_48), !_Var5)) {
              __assert_fail("distances && square_in_bounds(p->cave, min_grid)",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                            ,0x410,
                            "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                           );
            }
            if (local_40 != (loc *)0x0) {
              *local_40 = lVar8;
            }
            wVar7 = pfdistances_to_path(local_58,(loc_conflict)lVar8,local_38);
            release_pfdistances(local_58);
            if (L'\0' < wVar7) {
              return wVar7;
            }
            __assert_fail("path_length > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                          ,0x417,
                          "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                         );
          }
        }
        release_pfdistances(local_58);
        if (!_Var5) break;
        _Var4 = player_is_trapsafe(p);
        _Var5 = false;
      } while (!_Var4);
      plVar3 = local_40;
      _Var5 = false;
    } while (only_known);
    bVar2 = !bVar1;
    bVar1 = false;
    if (bVar2) {
      if (local_40 != (loc *)0x0) {
        lVar8 = (loc)loc(-1,-1);
        *plVar3 = lVar8;
      }
      if (local_38 != (int16_t **)0x0) {
        *local_38 = (int16_t *)0x0;
      }
      return L'\xffffffff';
    }
  } while( true );
}

Assistant:

int path_nearest_unknown(struct player *p, struct loc start,
		struct loc *dest_grid, int16_t **step_dirs)
{
	bool only_known = true, forbid_traps = true, passable = true;

	while (1) {
		struct pfdistances *distances = NULL;
		struct loc min_grid = loc(-1, -1);
		int min_turns = INT_MAX;
		struct loc grid;

		for (grid.y = 0; grid.y < p->cave->height; ++grid.y) {
			for (grid.x = 0; grid.x < p->cave->width; ++grid.x) {
				struct loc test_grid;
				int turns;

				if (loc_eq(grid, start)
						|| !square_isknown(p->cave,
						grid)) {
					continue;
				}
				if (passable) {
					if (!square_ispassable(p->cave, grid)
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown, false)
							== 8) {
						continue;
					}
					test_grid = grid;
				} else {
					if ((!square_iscloseddoor(p->cave, grid)
							&& !square_isrubble(
							p->cave, grid))
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown,
							false) == 8) {
						continue;
					}
					if (count_neighbors(&test_grid,
							p->cave, grid,
							square_isknownpassable,
							false) == 0 ||
							loc_eq(test_grid,
							start)) {
						continue;
					}
				}

				if (!distances) {
					distances = prepare_pfdistances(
						p, start, only_known,
						forbid_traps);
				}
				turns = pfdistances_to_turncount(distances,
					test_grid);
				if (turns > 0 && min_turns > turns) {
					min_turns = turns;
					min_grid = test_grid;
				}
			}
		}

		if (min_turns < INT_MAX) {
			int path_length;

			assert(distances
				&& square_in_bounds(p->cave, min_grid));
			if (dest_grid) {
				*dest_grid = min_grid;
			}
			path_length = pfdistances_to_path(distances,
				min_grid, step_dirs);
			release_pfdistances(distances);
			assert(path_length > 0);
			return path_length;
		}

		release_pfdistances(distances);
		/*
		 * No destination was found.  Try looser constraints on the
		 * grids that can be in the path.
		 */
		if (forbid_traps && !player_is_trapsafe(p)) {
			forbid_traps = false;
			continue;
		}
		if (only_known) {
			only_known = false;
			forbid_traps = true;
			continue;
		}
		/*
		 * Looser constraints did not help.  Try looking for known
		 * closed doors or known rubble with unknown neighbors.
		 */
		if (passable) {
			passable = false;
			only_known = true;
			forbid_traps = true;
			continue;
		}
		/* Nothing more to try.  Give up. */
		if (dest_grid) {
			*dest_grid = loc(-1, -1);
		}
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
}